

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O0

void __thiscall
TPZEqnArray<std::complex<long_double>_>::EqnForward
          (TPZEqnArray<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *F,
          DecomposeType dec)

{
  longdouble lVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  ostream *poVar5;
  void *pvVar6;
  int64_t iVar7;
  complex<long_double> *pcVar8;
  int in_EDX;
  TPZFMatrix<std::complex<long_double>_> *in_RSI;
  TPZEqnArray<std::complex<long_double>_> *in_RDI;
  int i_1;
  complex<long_double> udiag_1;
  int last_term_1;
  int index_1;
  int i;
  complex<long_double> udiag;
  int last_term;
  int index;
  int j;
  size_t in_stack_00000258;
  char *in_stack_00000260;
  complex<long_double> *pcVar9;
  undefined2 uVar10;
  undefined6 in_stack_fffffffffffffe42;
  undefined2 uVar11;
  undefined6 in_stack_fffffffffffffe52;
  int64_t in_stack_fffffffffffffe58;
  TPZFMatrix<std::complex<long_double>_> *in_stack_fffffffffffffe60;
  TPZFMatrix<std::complex<long_double>_> *in_stack_fffffffffffffea8;
  complex<long_double> *in_stack_fffffffffffffeb0;
  int local_10c;
  int local_dc;
  complex<long_double> local_d8;
  int local_ac;
  int local_7c;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  int local_4c;
  complex<long_double> local_48;
  int local_1c;
  int local_18;
  int local_14;
  TPZFMatrix<std::complex<long_double>_> *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  iVar3 = IsSymmetric(in_RDI);
  if (iVar3 == 1) {
    for (local_18 = 0; local_18 < in_RDI->fNumEq; local_18 = local_18 + 1) {
      piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)local_18);
      local_1c = *piVar4;
      TPZVec<std::complex<long_double>_>::operator[]
                ((TPZVec<std::complex<long_double>_> *)&in_RDI->fEqValues,(long)local_1c);
      lVar1 = (longdouble)0;
      pcVar9 = SUB108(lVar1,0);
      uVar10 = (undefined2)((unkuint10)lVar1 >> 0x40);
      pcVar8 = pcVar9;
      uVar11 = uVar10;
      std::complex<long_double>::complex(&local_48,lVar1,lVar1);
      bVar2 = std::operator==((complex<long_double> *)CONCAT62(in_stack_fffffffffffffe52,uVar11),
                              pcVar8);
      if (bVar2) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Diagonal Value = 0 >> Aborting on Index = ")
        ;
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1c);
        poVar5 = std::operator<<(poVar5," Equation = ");
        pvVar6 = (void *)std::ostream::operator<<(poVar5,local_18);
        std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
        pzinternal::DebugStopImpl(in_stack_00000260,in_stack_00000258);
      }
      if (local_18 == in_RDI->fNumEq + -1) {
        iVar7 = TPZVec<std::complex<long_double>_>::NElements
                          ((TPZVec<std::complex<long_double>_> *)&in_RDI->fEqValues);
        local_4c = (int)iVar7;
      }
      else {
        piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)(local_18 + 1));
        local_4c = *piVar4;
      }
      if ((local_14 == 3) || (local_14 == 1)) {
        in_stack_fffffffffffffeb0 =
             TPZVec<std::complex<long_double>_>::operator[]
                       ((TPZVec<std::complex<long_double>_> *)&in_RDI->fEqValues,(long)local_1c);
        in_stack_fffffffffffffea8 = local_10;
        TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_1c);
        TPZFMatrix<std::complex<long_double>_>::operator()
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                   CONCAT62(in_stack_fffffffffffffe52,uVar11));
        std::complex<long_double>::operator/=
                  (in_stack_fffffffffffffeb0,(complex<long_double> *)in_stack_fffffffffffffea8);
      }
      TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_1c);
      pcVar8 = TPZFMatrix<std::complex<long_double>_>::operator()
                         (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                          CONCAT62(in_stack_fffffffffffffe52,uVar11));
      local_78 = *(undefined8 *)pcVar8->_M_value;
      local_70 = *(undefined8 *)(pcVar8->_M_value + 8);
      local_68 = *(undefined8 *)(pcVar8->_M_value + 0x10);
      local_60 = *(undefined8 *)(pcVar8->_M_value + 0x18);
      local_7c = local_1c;
      while (local_7c = local_7c + 1, local_7c < local_4c) {
        TPZVec<std::complex<long_double>_>::operator[]
                  ((TPZVec<std::complex<long_double>_> *)&in_RDI->fEqValues,(long)local_7c);
        std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffe42,uVar10),pcVar9);
        TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_7c);
        TPZFMatrix<std::complex<long_double>_>::operator()
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                   CONCAT62(in_stack_fffffffffffffe52,uVar11));
        std::complex<long_double>::operator-=
                  ((complex<long_double> *)CONCAT62(in_stack_fffffffffffffe42,uVar10),pcVar9);
      }
      if (local_14 == 4) {
        TPZVec<std::complex<long_double>_>::operator[]
                  ((TPZVec<std::complex<long_double>_> *)&in_RDI->fEqValues,(long)local_1c);
        TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_1c);
        TPZFMatrix<std::complex<long_double>_>::operator()
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                   CONCAT62(in_stack_fffffffffffffe52,uVar11));
        std::complex<long_double>::operator/=
                  (in_stack_fffffffffffffeb0,(complex<long_double> *)in_stack_fffffffffffffea8);
      }
    }
  }
  else {
    iVar3 = IsSymmetric(in_RDI);
    if (iVar3 == 2) {
      for (local_18 = 1; local_18 < in_RDI->fNumEq; local_18 = local_18 + 2) {
        piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)local_18);
        local_ac = *piVar4;
        TPZVec<std::complex<long_double>_>::operator[]
                  ((TPZVec<std::complex<long_double>_> *)&in_RDI->fEqValues,(long)local_ac);
        lVar1 = (longdouble)0;
        pcVar9 = SUB108(lVar1,0);
        uVar10 = (undefined2)((unkuint10)lVar1 >> 0x40);
        pcVar8 = pcVar9;
        uVar11 = uVar10;
        std::complex<long_double>::complex(&local_d8,lVar1,lVar1);
        bVar2 = std::operator==((complex<long_double> *)CONCAT62(in_stack_fffffffffffffe52,uVar11),
                                pcVar8);
        if (bVar2) {
          poVar5 = std::operator<<((ostream *)&std::cout,
                                   "Diagonal Value = 0 >> Aborting on Index = ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_ac);
          poVar5 = std::operator<<(poVar5," Equation = ");
          pvVar6 = (void *)std::ostream::operator<<(poVar5,local_18);
          std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
          pzinternal::DebugStopImpl(in_stack_00000260,in_stack_00000258);
        }
        if (local_18 == in_RDI->fNumEq + -1) {
          iVar7 = TPZVec<std::complex<long_double>_>::NElements
                            ((TPZVec<std::complex<long_double>_> *)&in_RDI->fEqValues);
          local_dc = (int)iVar7;
        }
        else {
          piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)(local_18 + 1));
          local_dc = *piVar4;
        }
        if ((local_14 == 3) || (local_14 == 1)) {
          TPZVec<std::complex<long_double>_>::operator[]
                    ((TPZVec<std::complex<long_double>_> *)&in_RDI->fEqValues,(long)local_ac);
          TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_ac);
          TPZFMatrix<std::complex<long_double>_>::operator()
                    (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                     CONCAT62(in_stack_fffffffffffffe52,uVar11));
          std::complex<long_double>::operator/=
                    (in_stack_fffffffffffffeb0,(complex<long_double> *)in_stack_fffffffffffffea8);
        }
        TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_ac);
        TPZFMatrix<std::complex<long_double>_>::operator()
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                   CONCAT62(in_stack_fffffffffffffe52,uVar11));
        local_10c = local_ac;
        while (local_10c = local_10c + 1, local_10c < local_dc) {
          TPZVec<std::complex<long_double>_>::operator[]
                    ((TPZVec<std::complex<long_double>_> *)&in_RDI->fEqValues,(long)local_10c);
          std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffe42,uVar10),pcVar9);
          in_stack_fffffffffffffe60 = local_10;
          TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_10c);
          TPZFMatrix<std::complex<long_double>_>::operator()
                    (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                     CONCAT62(in_stack_fffffffffffffe52,uVar11));
          std::complex<long_double>::operator-=
                    ((complex<long_double> *)CONCAT62(in_stack_fffffffffffffe42,uVar10),pcVar9);
        }
      }
    }
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::EqnForward(TPZFMatrix<TVar> & F, DecomposeType dec) {
	int j;
	if(IsSymmetric()==EIsSymmetric){
		
		for(j=0; j<fNumEq; j++) {
			int index = fEqStart[j];
			if(fEqValues[index] == (TVar)0.) {
				cout << "Diagonal Value = 0 >> Aborting on Index = " << index << " Equation = " << j << endl;
				DebugStop();
			}
			int last_term;
			if(j==fNumEq-1){
				last_term=fEqValues.NElements();
			}else last_term = fEqStart[j+1];
			
			/** cholesky e lu */
			if(dec==ECholesky || dec==ELU) {
				F(fIndex[index],0) /= fEqValues[index];
			}
			/** ldlt cholesky lu */
			TVar udiag = F(fIndex[index],0);
			
			int i;
			//+1 ou +2
			for(i = index + 1; i < last_term; i++) F(fIndex[i],0) -= udiag * fEqValues[i];
			/** finalizacao para ldlt */
			if(dec == ELDLt) F(fIndex[index],0) /= fEqValues[index];
		}
	} else if(IsSymmetric()==EIsNonSymmetric) {
		for(j=1; j<fNumEq; j+=2) {
			int index = fEqStart[j];
			
			if(fEqValues[index] == (TVar)0.){
				cout << "Diagonal Value = 0 >> Aborting on Index = " << index << " Equation = " << j << endl;
				DebugStop();
			}          
			
			int last_term;
			if(j==fNumEq-1){
				last_term=fEqValues.NElements();
			}else last_term = fEqStart[j+1];
			//if(fEqStart.NElements()
			
			
			/** cholesky e lu */
			if(dec==ECholesky || dec==ELU) {
				F(fIndex[index],0) /= fEqValues[index];
			}
			/** ldlt cholesky lu */
			TVar udiag = F(fIndex[index],0);
			
			
			int i;
			for(i = index + 1; i < last_term; i++) F(fIndex[i],0) -= udiag * fEqValues[i];
		}
	}
}